

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintIo(FILE *pFile,Abc_Ntk_t *pNtk,int fPrintFlops)

{
  Abc_Obj_t *pObj;
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  fprintf((FILE *)pFile,"Primary inputs (%d): ",(ulong)(uint)pNtk->vPis->nSize);
  pVVar2 = pNtk->vPis;
  if (0 < pVVar2->nSize) {
    uVar5 = 0;
    do {
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[uVar5]);
      fprintf((FILE *)pFile," %d=%s",uVar5 & 0xffffffff,pcVar1);
      uVar5 = uVar5 + 1;
      pVVar2 = pNtk->vPis;
    } while ((long)uVar5 < (long)pVVar2->nSize);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,"Primary outputs (%d):",(ulong)(uint)pNtk->vPos->nSize);
  pVVar2 = pNtk->vPos;
  if (0 < pVVar2->nSize) {
    uVar5 = 0;
    do {
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[uVar5]);
      fprintf((FILE *)pFile," %d=%s",uVar5 & 0xffffffff,pcVar1);
      uVar5 = uVar5 + 1;
      pVVar2 = pNtk->vPos;
    } while ((long)uVar5 < (long)pVVar2->nSize);
  }
  fputc(10,(FILE *)pFile);
  if (fPrintFlops != 0) {
    fprintf((FILE *)pFile,"Latches (%d):  ",(ulong)(uint)pNtk->nObjCounts[8]);
    pVVar2 = pNtk->vBoxes;
    if (0 < pVVar2->nSize) {
      lVar6 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar2->pArray[lVar6];
        if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
          pcVar1 = Abc_ObjName(pObj);
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray]);
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
          fprintf((FILE *)pFile," %s(%s=%s)",pcVar1,pcVar3,pcVar4);
        }
        lVar6 = lVar6 + 1;
        pVVar2 = pNtk->vBoxes;
      } while (lVar6 < pVVar2->nSize);
    }
    fputc(10,(FILE *)pFile);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintIo( FILE * pFile, Abc_Ntk_t * pNtk, int fPrintFlops )
{
    Abc_Obj_t * pObj;
    int i;

    fprintf( pFile, "Primary inputs (%d): ", Abc_NtkPiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
//        fprintf( pFile, " %s(%d)", Abc_ObjName(pObj), Abc_ObjFanoutNum(pObj) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Primary outputs (%d):", Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
    fprintf( pFile, "\n" );

    if ( !fPrintFlops )
        return;

    fprintf( pFile, "Latches (%d):  ", Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, " %s(%s=%s)", Abc_ObjName(pObj),
            Abc_ObjName(Abc_ObjFanout0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    fprintf( pFile, "\n" );
}